

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

void __thiscall procxx::pipe_streambuf::flush(pipe_streambuf *this)

{
  pipe_end pVar1;
  uint uVar2;
  int __fd;
  long lVar3;
  long lVar4;
  size_t in_RCX;
  int __oflag;
  pipe_streambuf *this_local;
  
  pVar1 = pipe_t::write_end();
  uVar2 = pipe_t::open(&this->stdin_pipe_,(char *)(ulong)pVar1.end_,__oflag);
  if ((uVar2 & 1) != 0) {
    __fd = std::streambuf::pbase();
    lVar3 = std::streambuf::pptr();
    lVar4 = std::streambuf::pbase();
    pipe_t::write(&this->stdin_pipe_,__fd,(void *)(lVar3 - lVar4),in_RCX);
    std::streambuf::pptr();
    std::streambuf::pbase();
    std::streambuf::pbump((int)this);
  }
  return;
}

Assistant:

void flush() override {
    if (stdin_pipe_.open(pipe_t::write_end())) {
      stdin_pipe_.write(pbase(), static_cast<std::size_t>(pptr() - pbase()));
      pbump(static_cast<int>(-(pptr() - pbase())));
    }
  }